

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Detonation_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::LE_Detonation_PDU::SetEventNumberIncludedFlag(LE_Detonation_PDU *this,KBOOL F)

{
  KBOOL F_local;
  LE_Detonation_PDU *this_local;
  
  if (F != (KBOOL)((this->m_DetonationFlag2Union).m_ui8Flag >> 1 & 1)) {
    (this->m_DetonationFlag2Union).m_ui8Flag =
         (this->m_DetonationFlag2Union).m_ui8Flag & 0xfd | F << 1;
    SetFlag2Flag(this,(this->m_DetonationFlag2Union).m_ui8Flag != '\0');
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 2;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 2;
    }
  }
  return;
}

Assistant:

void LE_Detonation_PDU::SetEventNumberIncludedFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_DetonationFlag2Union.m_ui8EventNum )return;

    m_DetonationFlag2Union.m_ui8EventNum = F;

    SetFlag2Flag( m_DetonationFlag2Union.m_ui8Flag != 0 );

    if( F )
    {
        m_ui16PDULength += 2; // 2 = size of event number field
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}